

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool __thiscall Path::isHeader(Path *this)

{
  bool bVar1;
  char *ext;
  undefined1 local_11;
  Path *this_local;
  
  bVar1 = isFile(this);
  local_11 = false;
  if (bVar1) {
    ext = extension(this,(size_t *)0x0);
    local_11 = isHeader(ext);
  }
  return local_11;
}

Assistant:

bool Path::isHeader() const
{
    return isFile() && isHeader(extension());
}